

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  wchar16 *baseURL;
  XSTSHarnessHandlers *this;
  long lVar6;
  ulong uVar7;
  long lVar8;
  StrX local_80;
  uint local_74;
  XMLCh *uniFile;
  RootExtractor rootExtractor;
  
  if (1 < argC) {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    local_74 = argC;
    for (lVar8 = 0; (ulong)(uint)argC - 1 != lVar8; lVar8 = lVar8 + 1) {
      pcVar2 = argV[lVar8 + 1];
      if (*pcVar2 != '-') {
        if (local_74 + -2 == (int)lVar8) {
          plVar5 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                      (XMLGrammarPool *)0x0);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
          pcVar2 = argV[lVar8 + 1];
          rootExtractor.super_DefaultHandler.super_EntityResolver._vptr_EntityResolver =
               (_func_int **)&PTR__DefaultHandler_0010e388;
          rootExtractor.super_DefaultHandler.super_DTDHandler._vptr_DTDHandler =
               (_func_int **)&PTR__RootExtractor_0010e4a0;
          rootExtractor.super_DefaultHandler.super_ContentHandler._vptr_ContentHandler =
               (_func_int **)&PTR__RootExtractor_0010e4d8;
          rootExtractor.super_DefaultHandler.super_ErrorHandler._vptr_ErrorHandler =
               (_func_int **)&PTR__RootExtractor_0010e550;
          rootExtractor.super_DefaultHandler.super_LexicalHandler._vptr_LexicalHandler =
               (_func_int **)&PTR__RootExtractor_0010e590;
          rootExtractor.super_DefaultHandler.super_DeclHandler._vptr_DeclHandler =
               (_func_int **)&PTR__RootExtractor_0010e5e8;
          rootExtractor.fIsXMLSuite = false;
          (**(code **)(*plVar5 + 0x40))(plVar5);
          (**(code **)(*plVar5 + 0x80))(plVar5,pcVar2);
          uniFile = (XMLCh *)xercesc_4_0::XMLString::transcode
                                       (pcVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          lVar8 = xercesc_4_0::XMLString::stringLen(pcVar2);
          uVar7 = 0xffffffffffffffff;
          if (-1 < lVar8 + 9) {
            uVar7 = lVar8 * 2 + 0x12;
          }
          baseURL = (wchar16 *)operator_new__(uVar7);
          xercesc_4_0::XMLString::fixURI(uniFile,baseURL);
          if (rootExtractor.fIsXMLSuite == true) {
            this = (XSTSHarnessHandlers *)operator_new(0x120);
            XMLHarnessHandlers::XMLHarnessHandlers((XMLHarnessHandlers *)this,baseURL,g_scanner);
          }
          else {
            this = (XSTSHarnessHandlers *)operator_new(0x3e0);
            XSTSHarnessHandlers::XSTSHarnessHandlers(this,baseURL,g_scanner);
          }
          xercesc_4_0::XMLString::release(&uniFile,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          operator_delete__(baseURL);
          (**(code **)(*plVar5 + 0x40))
                    (plVar5,&(this->super_BaseHarnessHandlers).super_DefaultHandler.
                             super_ContentHandler);
          (**(code **)(*plVar5 + 0x58))
                    (plVar5,&(this->super_BaseHarnessHandlers).super_DefaultHandler.
                             super_ErrorHandler);
          lVar8 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
          (**(code **)(*plVar5 + 0x80))(plVar5,pcVar2);
          lVar6 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
          local_74 = (uint)(this->super_BaseHarnessHandlers).fSawErrors;
          poVar4 = std::operator<<((ostream *)&std::cout,"Scanner: ");
          StrX::StrX(&local_80,g_scanner);
          std::operator<<(poVar4,local_80.fLocalForm);
          std::endl<char,std::char_traits<char>>(poVar4);
          StrX::~StrX(&local_80);
          poVar4 = std::operator<<((ostream *)&std::cout,"  Total tests: ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cout,"  Failed tests: ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::operator<<((ostream *)&std::cout,"  Success rate: ");
          uVar1 = (this->super_BaseHarnessHandlers).fTests;
          poVar4 = std::ostream::_M_insert<double>
                             (((double)(uVar1 - (this->super_BaseHarnessHandlers).fFailures) /
                              (double)uVar1) * 100.0);
          poVar4 = std::operator<<(poVar4,"%");
          std::endl<char,std::char_traits<char>>(poVar4);
          std::operator<<((ostream *)&std::cout,"  Duration: ");
          uVar7 = lVar6 - lVar8;
          if (60000 < uVar7) {
            uVar7 = uVar7 % 60000;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::operator<<(poVar4,":");
          }
          if (uVar7 < 10000) {
            std::operator<<((ostream *)&std::cout,"0");
          }
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          poVar4 = std::operator<<(poVar4,".");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
          (**(code **)(*plVar5 + 8))(plVar5);
          (*(this->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver.
            _vptr_EntityResolver[1])(this);
          xercesc_4_0::XMLPlatformUtils::Terminate();
          return (local_74 & 0xff) << 2;
        }
        break;
      }
      if ((pcVar2[1] == '?') && (pcVar2[2] == '\0')) {
        usage();
        return 2;
      }
      iVar3 = strncmp(pcVar2,"-scanner=",9);
      if (iVar3 == 0) {
        g_scanner = (XMLCh *)xercesc_4_0::XMLString::transcode
                                       (pcVar2 + 9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Unknown option \'");
        poVar4 = std::operator<<(poVar4,argV[lVar8 + 1]);
        poVar4 = std::operator<<(poVar4,"\', ignoring it\n");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
  }
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cout << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
        // TODO: add option to generate the XML summarizing the result
        else if (!strncmp(argV[argInd], "-scanner=", 9))
        {
            g_scanner = XMLString::transcode(argV[argInd]+9);
        }
        else
        {
            std::cout << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    //
    //  Create a SAX parser object.
    //
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader();
    parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
    parser->setFeature(XMLUni::fgSAX2CoreValidation, false);

    const char* xmlFile = argV[argInd];

    // Discover if the test suite is the XML or XMLSchema one
    RootExtractor rootExtractor;
    parser->setContentHandler(&rootExtractor);
    try
    {
        parser->parse(xmlFile);
    }
    catch (...)
    {
    }

    XMLCh* uniFile = XMLString::transcode(xmlFile);
    XMLCh* uri = new XMLCh[XMLString::stringLen(xmlFile) + 9];
    XMLString::fixURI(uniFile, uri);
    BaseHarnessHandlers* handler=NULL;
    if(rootExtractor.isXMLSuite())
    {
        // XML Test Suite
        handler=new XMLHarnessHandlers(uri, g_scanner);
    }
    else
    {
        // XMLSchema Test Suite
        handler=new XSTSHarnessHandlers(uri, g_scanner);
    }
    XMLString::release(&uniFile);
    delete [] uri;
    parser->setContentHandler(handler);
    parser->setErrorHandler(handler);

    bool errorOccurred=false;
    const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propagate out of it.
    //
    try
    {
        parser->parse(xmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cout << "OutOfMemoryException" << std::endl;
        errorOccurred = true;
    }
    catch (const XMLException& e)
    {
        std::cout << "\nError during parsing: '" << xmlFile << "'\n"
            << "Exception message is:  \n"
            << StrX(e.getMessage()) << "\n" << std::endl;
        errorOccurred = true;
    }
    catch (...)
    {
        std::cout << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
        errorOccurred = true;
    }

    const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
    unsigned long duration = endMillis - startMillis;

    if (handler->getSawErrors())
        errorOccurred = true;

    std::cout << "Scanner: " << StrX(g_scanner) << std::endl;
    std::cout << "  Total tests: " << handler->getTotalTests() << std::endl;
    std::cout << "  Failed tests: " << handler->getFailedTests() << std::endl;
    std::cout << "  Success rate: " << ((double)(handler->getTotalTests()-handler->getFailedTests()))/(double)handler->getTotalTests()*100 << "%" << std::endl;
    std::cout << "  Duration: ";
    if(duration > 60000)
    {
        std::cout << duration/60000 << ":";
        duration=duration % 60000;
    }
    if(duration/1000 < 10)
        std::cout << "0";
    std::cout << duration/1000 << "." << duration % 1000 << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;
    delete handler;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}